

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_errno.c
# Opt level: O0

ngx_int_t ngx_strerror_init(void)

{
  uint __errnum;
  u_char *__dest;
  uint *puVar1;
  char *pcVar2;
  int local_2c;
  size_t sStack_28;
  ngx_err_t err;
  size_t len;
  u_char *p;
  char *msg;
  
  sStack_28 = 0x6b0;
  ngx_sys_errlist = (ngx_str_t *)malloc(0x6b0);
  if (ngx_sys_errlist == (ngx_str_t *)0x0) {
LAB_0014bc9b:
    puVar1 = (uint *)__errno_location();
    __errnum = *puVar1;
    pcVar2 = strerror(__errnum);
    ngx_log_stderr(0,"malloc(%uz) failed (%d: %s)",sStack_28,(ulong)__errnum,pcVar2);
    msg = (char *)0xffffffffffffffff;
  }
  else {
    for (local_2c = 0; local_2c < 0x6b; local_2c = local_2c + 1) {
      pcVar2 = strerror(local_2c);
      sStack_28 = strlen(pcVar2);
      __dest = (u_char *)malloc(sStack_28);
      if (__dest == (u_char *)0x0) goto LAB_0014bc9b;
      memcpy(__dest,pcVar2,sStack_28);
      ngx_sys_errlist[local_2c].len = sStack_28;
      ngx_sys_errlist[local_2c].data = __dest;
    }
    msg = (char *)0x0;
  }
  return (ngx_int_t)msg;
}

Assistant:

ngx_int_t
ngx_strerror_init(void)
{
    char       *msg;
    u_char     *p;
    size_t      len;
    ngx_err_t   err;

    /*
     * ngx_strerror() is not ready to work at this stage, therefore,
     * malloc() is used and possible errors are logged using strerror().
     */

    len = NGX_SYS_NERR * sizeof(ngx_str_t);

    ngx_sys_errlist = malloc(len);
    if (ngx_sys_errlist == NULL) {
        goto failed;
    }

    for (err = 0; err < NGX_SYS_NERR; err++) {
        msg = strerror(err);
        len = ngx_strlen(msg);

        p = malloc(len);
        if (p == NULL) {
            goto failed;
        }

        ngx_memcpy(p, msg, len);
        ngx_sys_errlist[err].len = len;
        ngx_sys_errlist[err].data = p;
    }

    return NGX_OK;

failed:

    err = errno;
    ngx_log_stderr(0, "malloc(%uz) failed (%d: %s)", len, err, strerror(err));

    return NGX_ERROR;
}